

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy_testcase_api_tests.cpp
# Opt level: O3

void __thiscall
iu_EventListenerTest_x_iutest_x_FlagCheck_Test::Body
          (iu_EventListenerTest_x_iutest_x_FlagCheck_Test *this)

{
  char *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_211;
  string local_210;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  byte local_1d0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  local_1d0 = listener->called_OnTestCaseStart;
  local_1e8 = 0;
  local_1e0 = 0;
  local_1f0 = &local_1e0;
  if ((bool)local_1d0 == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&local_1f0,
               (AssertionResult *)"listener->called_OnTestCaseStart","false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_210._M_dataplus._M_p,&local_211);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xc2;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
  }
  else {
    local_1d0 = listener->called_OnTestCaseEnd ^ 1;
    local_1e8 = 0;
    local_1e0 = 0;
    if (listener->called_OnTestCaseEnd == false) {
      return;
    }
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)&local_1f0,(AssertionResult *)"listener->called_OnTestCaseEnd"
               ,"true","false",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,local_210._M_dataplus._M_p,&local_211);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/legacy_testcase_api_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0xc3;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,CONCAT71(uStack_1df,local_1e0) + 1);
  }
  return;
}

Assistant:

IUTEST(EventListenerTest, FlagCheck)
{
    IUTEST_ASSERT_TRUE( listener->called_OnTestCaseStart );
    IUTEST_ASSERT_FALSE( listener->called_OnTestCaseEnd );
}